

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::LevelIndex(int lx,int ly,int tile_level_mode,int num_x_levels)

{
  int num_x_levels_local;
  int tile_level_mode_local;
  int ly_local;
  int lx_local;
  int local_4;
  
  if (tile_level_mode == 0) {
    local_4 = 0;
  }
  else {
    local_4 = lx;
    if (tile_level_mode != 1) {
      if (tile_level_mode == 2) {
        local_4 = lx + ly * num_x_levels;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int LevelIndex(int lx, int ly, int tile_level_mode, int num_x_levels) {
  switch (tile_level_mode) {
  case TINYEXR_TILE_ONE_LEVEL:
    return 0;

  case TINYEXR_TILE_MIPMAP_LEVELS:
    return lx;

  case TINYEXR_TILE_RIPMAP_LEVELS:
    return lx + ly * num_x_levels;

  default:
    assert(false);
  }
  return 0;
}